

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::LowerBailOnCreatedMissingValue(Lowerer *this,Instr *instr,bool isInHelperBlock)

{
  OpCode OVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  LabelInstr *target;
  AddrOpnd *opnd;
  Instr *this_00;
  RegOpnd *opnd_00;
  IntConstOpnd *compareSrc2;
  Opnd *pOVar7;
  LowererMD *this_01;
  Lowerer *this_02;
  undefined1 local_80 [8];
  AutoReuseOpnd autoReuseCreatedFirstMissingValueOpnd;
  AutoReuseOpnd autoReuseArrayFlagsBeforeHelperCallOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType baseValueType;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34eb,"(instr)","instr");
    if (!bVar3) goto LAB_005d0c20;
    *puVar5 = 0;
  }
  OVar1 = instr->m_opcode;
  if (((1 < OVar1 - 0x203) && (OVar1 != StElemI_A)) && (OVar1 != StElemI_A_Strict)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34ec,
                       "(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy)"
                       ,
                       "instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy"
                      );
    if (!bVar3) goto LAB_005d0c20;
    *puVar5 = 0;
  }
  pOVar7 = instr->m_dst;
  if (pOVar7 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34ed,"(instr->GetDst())","instr->GetDst()");
    if (!bVar3) goto LAB_005d0c20;
    *puVar5 = 0;
    pOVar7 = instr->m_dst;
  }
  OVar4 = IR::Opnd::GetKind(pOVar7);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34ee,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar3) goto LAB_005d0c20;
    *puVar5 = 0;
  }
  func = instr->m_func;
  pOVar7 = instr->m_dst;
  OVar4 = IR::Opnd::GetKind(pOVar7);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar3) goto LAB_005d0c20;
    *puVar5 = 0;
  }
  pOVar7 = (Opnd *)pOVar7[1]._vptr_Opnd;
  local_32[0] = (pOVar7->m_valueType).field_0;
  bVar3 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34f4,"(!baseValueType.IsNotArrayOrObjectWithArray())",
                       "!baseValueType.IsNotArrayOrObjectWithArray()");
    if (!bVar3) goto LAB_005d0c20;
    *puVar5 = 0;
  }
  autoReuseCreatedFirstMissingValueOpnd.autoDelete = false;
  autoReuseCreatedFirstMissingValueOpnd.wasInUse = false;
  autoReuseCreatedFirstMissingValueOpnd._18_6_ = 0;
  bVar3 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
  if (bVar3) {
    bVar3 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
    if (!bVar3) goto LAB_005d097f;
    opnd = (AddrOpnd *)0x0;
  }
  else {
LAB_005d097f:
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar7);
    pIVar6 = IR::Instr::New(Call,func);
    opnd = (AddrOpnd *)IR::RegOpnd::New(TyUint64,func);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseCreatedFirstMissingValueOpnd.autoDelete,(Opnd *)opnd,func,
               true);
    IR::Instr::SetDst(pIVar6,(Opnd *)opnd);
    IR::Instr::InsertBefore(instr,pIVar6);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,pIVar6,HelperArray_Jit_GetArrayFlagsForArrayOrObjectWithArray,
               (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  }
  target = IR::Instr::GetOrCreateContinueLabel(instr,isInHelperBlock);
  LowerOneBailOutKind(this,instr,BailOutOnMissingValue,false,false);
  pIVar6 = instr->m_next;
  bVar3 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
  if (bVar3) {
    bVar3 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
    if (bVar3) {
      if (opnd != (AddrOpnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3510,"(!arrayFlagsBeforeHelperCallOpnd)",
                           "!arrayFlagsBeforeHelperCallOpnd");
        if (!bVar3) goto LAB_005d0c20;
        *puVar5 = 0;
      }
      opnd = IR::AddrOpnd::New(&DAT_00000004,AddrOpndKindConstantVar,func,true,(Var)0x0);
      IR::AutoReuseOpnd::Initialize
                ((AutoReuseOpnd *)&autoReuseCreatedFirstMissingValueOpnd.autoDelete,
                 &opnd->super_Opnd,func,true);
      goto LAB_005d0b32;
    }
  }
  if (opnd == (AddrOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3522,"(arrayFlagsBeforeHelperCallOpnd)","arrayFlagsBeforeHelperCallOpnd");
    if (!bVar3) {
LAB_005d0c20:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    opnd = (AddrOpnd *)0x0;
  }
LAB_005d0b32:
  this_01 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_01,pIVar6,pOVar7);
  LowererMD::LoadHelperArgument(this_01,pIVar6,&opnd->super_Opnd);
  this_00 = IR::Instr::New(Call,func);
  opnd_00 = IR::RegOpnd::New(TyUint8,func);
  local_80 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_80,&opnd_00->super_Opnd,func,true);
  IR::Instr::SetDst(this_00,&opnd_00->super_Opnd);
  IR::Instr::InsertBefore(pIVar6,this_00);
  LowererMD::ChangeToHelperCall
            (this_01,this_00,HelperArray_Jit_OperationCreatedFirstMissingValue,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  this_02 = (Lowerer *)0x0;
  compareSrc2 = IR::IntConstOpnd::New(0,(opnd_00->super_Opnd).m_type,func,true);
  InsertCompareBranch(this_02,&opnd_00->super_Opnd,&compareSrc2->super_Opnd,BrEq_A,false,target,
                      pIVar6,false);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_80);
  IR::AutoReuseOpnd::~AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseCreatedFirstMissingValueOpnd.autoDelete);
  return;
}

Assistant:

void Lowerer::LowerBailOnCreatedMissingValue(IR::Instr *const instr, const bool isInHelperBlock)
{
    /*
        // Generate checks for whether the first missing value was created during the helper call

        if(!(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues()))
        {
            // Record whether the array has missing values before the helper call
            arrayFlagsBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayFlagsForArrayOrObjectWithArray(base)
        }

        helperCall:
            (Helper call and other bailout checks)

        // If the array had no missing values before the helper call, and the array has missing values after the helper
        // call, then this store created the first missing value in the array and needs to bail out
        if(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues())
            (arrayFlagsBeforeHelperCall = Js::DynamicObjectFlags::HasNoMissingValues)
        createdFirstMissingValue = JavascriptArray::Jit_OperationCreatedFirstMissingValue(arrayFlagsBeforeHelperCall, base)
        test createdFirstMissingValue, createdFirstMissingValue
        jz $skipBailOut

        (Bail out with IR::BailOutOnMissingValue)

        $skipBailOut:
    */

    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy);
    Assert(instr->GetDst());
    Assert(instr->GetDst()->IsIndirOpnd());

    Func *const func = instr->m_func;

    IR::RegOpnd *const baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    Assert(!baseValueType.IsNotArrayOrObjectWithArray());

    IR::Opnd *arrayFlagsBeforeHelperCallOpnd = nullptr;
    IR::AutoReuseOpnd autoReuseArrayFlagsBeforeHelperCallOpnd;
    const IRType arrayFlagsType = sizeof(uintptr_t) == sizeof(uint32) ? TyUint32 : TyUint64;
    if(!(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues()))
    {
        // Record whether the array has missing values before the helper call
        //     arrayFlagsBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayFlagsForArrayOrObjectWithArray(base)
        m_lowererMD.LoadHelperArgument(instr, baseOpnd);
        IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
        arrayFlagsBeforeHelperCallOpnd = IR::RegOpnd::New(arrayFlagsType, func);
        autoReuseArrayFlagsBeforeHelperCallOpnd.Initialize(arrayFlagsBeforeHelperCallOpnd, func);
        callInstr->SetDst(arrayFlagsBeforeHelperCallOpnd);
        instr->InsertBefore(callInstr);
        m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_GetArrayFlagsForArrayOrObjectWithArray);
    }

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(isInHelperBlock);
    LowerOneBailOutKind(instr, IR::BailOutOnMissingValue, isInHelperBlock);
    IR::Instr *const insertBeforeInstr = instr->m_next;

    // If the array had no missing values before the helper call, and the array has missing values after the helper
    // call, then this store created the first missing value in the array and needs to bail out

    if(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues())
    {
        //     (arrayFlagsBeforeHelperCall = Js::DynamicObjectFlags::HasNoMissingValues)
        Assert(!arrayFlagsBeforeHelperCallOpnd);
        arrayFlagsBeforeHelperCallOpnd =
            arrayFlagsType == TyUint32
                ? static_cast<IR::Opnd *>(
                    IR::IntConstOpnd::New(
                        static_cast<uintptr_t>(Js::DynamicObjectFlags::HasNoMissingValues),
                        arrayFlagsType,
                        func,
                        true))
                : IR::AddrOpnd::New(
                    reinterpret_cast<void *>(Js::DynamicObjectFlags::HasNoMissingValues),
                    IR::AddrOpndKindConstantVar,
                    func,
                    true);
        autoReuseArrayFlagsBeforeHelperCallOpnd.Initialize(arrayFlagsBeforeHelperCallOpnd, func);
    }
    else
    {
        Assert(arrayFlagsBeforeHelperCallOpnd);
    }

    //     createdFirstMissingValue = JavascriptArray::Jit_OperationCreatedFirstMissingValue(arrayFlagsBeforeHelperCall, base)
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, baseOpnd);
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, arrayFlagsBeforeHelperCallOpnd);
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
    IR::RegOpnd *const createdFirstMissingValueOpnd = IR::RegOpnd::New(TyUint8, func);
    IR::AutoReuseOpnd autoReuseCreatedFirstMissingValueOpnd(createdFirstMissingValueOpnd, func);
    callInstr->SetDst(createdFirstMissingValueOpnd);
    insertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_OperationCreatedFirstMissingValue);

    //     test createdFirstMissingValue, createdFirstMissingValue
    //     jz $skipBailOut
    InsertCompareBranch(
        createdFirstMissingValueOpnd,
        IR::IntConstOpnd::New(0, createdFirstMissingValueOpnd->GetType(), func, true),
        Js::OpCode::BrEq_A,
        skipBailOutLabel,
        insertBeforeInstr);

    //     (Bail out with IR::BailOutOnMissingValue)
    //     $skipBailOut:
}